

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O0

llama_grammar_stack * __thiscall llama_grammar_parser::c_rules(llama_grammar_parser *this)

{
  bool bVar1;
  vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_> *in_RSI;
  llama_grammar_stack *in_RDI;
  vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *rule;
  const_iterator __end1;
  const_iterator __begin1;
  llama_grammar_rules *__range1;
  llama_grammar_stack *ret;
  __normal_iterator<const_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
  in_stack_ffffffffffffffc8;
  vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>
  *in_stack_ffffffffffffffd0;
  
  std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>::vector
            ((vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>
              *)0x3f19be);
  std::
  vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
  ::size((vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
          *)(in_RSI + 2));
  std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>::
  reserve(in_stack_ffffffffffffffd0,(size_type)in_stack_ffffffffffffffc8._M_current);
  std::
  vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
  ::begin((vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
           *)in_RDI);
  std::
  vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
  ::end((vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>
         *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
                             *)in_RSI,
                            (__normal_iterator<const_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
                             *)in_RDI), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
    ::operator*((__normal_iterator<const_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
                 *)&stack0xffffffffffffffc8);
    std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>::data
              ((vector<llama_grammar_element,_std::allocator<llama_grammar_element>_> *)0x3f1a35);
    std::vector<const_llama_grammar_element_*,_std::allocator<const_llama_grammar_element_*>_>::
    push_back(in_RSI,(value_type *)in_RDI);
    __gnu_cxx::
    __normal_iterator<const_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
    ::operator++((__normal_iterator<const_std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_*,_std::vector<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>,_std::allocator<std::vector<llama_grammar_element,_std::allocator<llama_grammar_element>_>_>_>_>
                  *)&stack0xffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

llama_grammar_stack llama_grammar_parser::c_rules() const {
    llama_grammar_stack ret;
    ret.reserve(rules.size());
    for (const auto & rule : rules) {
        ret.push_back(rule.data());
    }
    return ret;
}